

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddPointEdge
          (CrossingProcessor *this,S2Point *p,int dimension)

{
  pointer *ppcVar1;
  S2Builder *pSVar2;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  iterator __position;
  char local_31;
  SourceEdgeCrossing local_30;
  
  pSVar2 = this->builder_;
  if (pSVar2 != (S2Builder *)0x0) {
    if (this->prev_inside_ == false) {
      local_30.first = (SourceId)0xffffffff00000000;
      local_30.second = true;
      AddCrossing(this,&local_30);
    }
    this_00 = this->input_dimensions_;
    local_31 = (char)dimension;
    __position._M_current =
         (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<signed_char,_std::allocator<signed_char>_>::_M_realloc_insert<signed_char>
                (this_00,__position,&local_31);
    }
    else {
      *__position._M_current = local_31;
      ppcVar1 = &(this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    S2Builder::AddEdge(this->builder_,p,p);
    this->prev_inside_ = true;
  }
  return pSVar2 != (S2Builder *)0x0;
}

Assistant:

bool AddPointEdge(const S2Point& p, int dimension) {
    if (builder_ == nullptr) return false;  // Boolean output.
    if (!prev_inside_) SetClippingState(kSetInside, true);
    input_dimensions_->push_back(dimension);
    builder_->AddEdge(p, p);
    prev_inside_ = true;
    return true;
  }